

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O1

void __thiscall
mp::internal::
NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>>
::
ReadBounds<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>>::VarHandler>
          (NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>>
           *this)

{
  int iVar1;
  TextReader<fmt::Locale> *this_00;
  char *loc;
  pointer pVVar2;
  double dVar3;
  char *format_str;
  int index;
  double dVar4;
  double dVar5;
  double dVar6;
  BasicProblem<mp::BasicProblemParams<int>_> *local_58;
  undefined8 uStack_50;
  ArgList local_40;
  
  TextReader<fmt::Locale>::ReadTillEndOfLine(*(TextReader<fmt::Locale> **)this);
  iVar1 = **(int **)(this + 8);
  if (0 < iVar1) {
    dVar4 = 0.0;
    index = 0;
    dVar6 = 0.0;
    do {
      this_00 = *(TextReader<fmt::Locale> **)this;
      loc = (this_00->super_ReaderBase).ptr_;
      (this_00->super_ReaderBase).token_ = loc;
      (this_00->super_ReaderBase).ptr_ = loc + 1;
      dVar5 = INFINITY;
      dVar3 = -INFINITY;
      switch(*loc) {
      case '0':
        dVar3 = TextReader<fmt::Locale>::ReadDouble(this_00);
        dVar5 = TextReader<fmt::Locale>::ReadDouble(*(TextReader<fmt::Locale> **)this);
        break;
      case '1':
        dVar5 = TextReader<fmt::Locale>::ReadDouble(this_00);
        dVar3 = -INFINITY;
        break;
      case '2':
        dVar3 = TextReader<fmt::Locale>::ReadDouble(this_00);
        dVar5 = INFINITY;
        break;
      case '3':
        break;
      case '4':
        dVar5 = TextReader<fmt::Locale>::ReadDouble(this_00);
        dVar3 = dVar5;
        break;
      case '5':
        format_str = "COMPL bound type is invalid for variables";
        goto LAB_001f82c8;
      default:
        format_str = "expected bound";
LAB_001f82c8:
        local_40.types_ = 0;
        uStack_50._0_4_ = 0;
        uStack_50._4_4_ = 0;
        local_58 = (BasicProblem<mp::BasicProblemParams<int>_> *)0x0;
        local_40.field_1.values_ = (Value *)&local_58;
        TextReader<fmt::Locale>::DoReportError(this_00,loc,(CStringRef)format_str,&local_40);
        dVar5 = dVar6;
        dVar3 = dVar4;
      }
      dVar4 = dVar3;
      TextReader<fmt::Locale>::ReadTillEndOfLine(*(TextReader<fmt::Locale> **)this);
      BasicProblem<mp::BasicProblemParams<int>_>::MutVariable::MutVariable
                ((MutVariable *)&local_58,
                 *(BasicProblem<mp::BasicProblemParams<int>_> **)
                  (*(long *)(*(long *)(this + 0x10) + 8) + 8),index);
      pVVar2 = (local_58->vars_).
               super__Vector_base<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pVVar2[(int)uStack_50].lb = dVar4;
      pVVar2[(int)uStack_50].ub = dVar5;
      index = index + 1;
      dVar6 = dVar5;
    } while (iVar1 != index);
  }
  return;
}

Assistant:

void NLReader<Reader, Handler>::ReadBounds() {
  enum BoundType {
    RANGE,     // Both lower and upper bounds: l <= body <= u.
    UPPER,     // Only upper bound: body <= u.
    LOWER,     // Only lower bound: l <= body.
    FREE,      // No constraints on body (free variable or constraint).
    CONSTANT,  // Equal to constant: body = c.
    COMPL      // Body complements variable v[i - 1].
  };
  reader_.ReadTillEndOfLine();
  double lb = 0, ub = 0;
  BoundHandler bh(*this);
  int num_bounds = bh.num_items();
  double infinity = INFINITY;
  for (int i = 0; i < num_bounds; ++i) {
    switch (reader_.ReadChar() - '0') {
    case RANGE:
      lb = reader_.ReadDouble();
      ub = reader_.ReadDouble();
      break;
    case UPPER:
      lb = -infinity;
      ub = reader_.ReadDouble();
      break;
    case LOWER:
      lb = reader_.ReadDouble();
      ub = infinity;
      break;
    case FREE:
      lb = -infinity;
      ub =  infinity;
      break;
    case CONSTANT:
      lb = ub = reader_.ReadDouble();
      break;
    case COMPL:
      if (BoundHandler::TYPE == CON) {
        int flags = reader_.template ReadInt<int>();
        int var_index = reader_.ReadUInt();
        // Don't use NLReader::ReadUInt(int, int) as num_vars + 1 may overflow.
        if (var_index == 0 || var_index > header_.num_vars)
          reader_.ReportError("integer {} out of bounds", var_index);
        --var_index;
        int mask = ComplInfo::INF_LB | ComplInfo::INF_UB;
        handler_.OnComplementarity(i, var_index, ComplInfo(flags & mask));
        reader_.ReadTillEndOfLine();
        continue;
      }
      reader_.ReportError("COMPL bound type is invalid for variables");
      break;
    default:
      reader_.ReportError("expected bound");
    }
    reader_.ReadTillEndOfLine();
    bh.SetBounds(i, lb, ub);
  }
}